

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
nlohmann::json_abi_v3_11_3::detail::
concat<std::__cxx11::string,char_const(&)[17],std::__cxx11::string_const&,char,std::__cxx11::string,char_const(&)[3]>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,detail *this,char (*args) [17],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,char *args_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
          char (*args_4) [3])

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar3 = strlen((char *)this);
  lVar1 = *(long *)(*args + 8);
  lVar2 = *(long *)(args_2 + 8);
  sVar4 = strlen((char *)args_3);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,sVar4 + sVar3 + lVar1 + lVar2 + 1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,(char *)this);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,*(char **)*args,*(size_type *)(*args + 8));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (__return_storage_ptr__,*(char *)&(args_1->_M_dataplus)._M_p);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,*(char **)args_2,*(size_type *)(args_2 + 8));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,(char *)args_3);
  return __return_storage_ptr__;
}

Assistant:

inline OutStringType concat(Args && ... args)
{
    OutStringType str;
    str.reserve(concat_length(args...));
    concat_into(str, std::forward<Args>(args)...);
    return str;
}